

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_encoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialQuantizationAttributeEncoder::PrepareValues
          (SequentialQuantizationAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points)

{
  _Head_base<0UL,_draco::PointAttribute_*,_false> __p;
  bool bVar1;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> portable_attribute;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_38;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> local_30;
  
  AttributeTransform::InitTransformedAttribute
            ((AttributeTransform *)&local_38,
             (PointAttribute *)&this->attribute_quantization_transform_,
             (int)(this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
                  attribute_);
  bVar1 = AttributeQuantizationTransform::TransformAttribute
                    (&this->attribute_quantization_transform_,
                     (this->super_SequentialIntegerAttributeEncoder).
                     super_SequentialAttributeEncoder.attribute_,point_ids,local_38._M_head_impl);
  __p._M_head_impl = local_38._M_head_impl;
  if (bVar1) {
    local_38._M_head_impl = (pointer)0x0;
    local_30._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
         (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)0x0
    ;
    std::__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::reset
              ((__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                *)&(this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
                   portable_attribute_,__p._M_head_impl);
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               &local_30);
  }
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             &local_38);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeEncoder::PrepareValues(
    const std::vector<PointIndex> &point_ids, int num_points) {
  auto portable_attribute =
      attribute_quantization_transform_.InitTransformedAttribute(
          *attribute(), point_ids.size());
  if (!attribute_quantization_transform_.TransformAttribute(
          *(attribute()), point_ids, portable_attribute.get())) {
    return false;
  }
  SetPortableAttribute(std::move(portable_attribute));
  return true;
}